

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O0

int TVMFuncCall(TVMFunctionHandle func,TVMValue *args,int *arg_type_codes,int num_args,
               TVMValue *ret_val,int *ret_type_code)

{
  TVMArgs args_00;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  size_t sVar4;
  int64_t iVar5;
  runtime_error *_except_;
  TVMRuntimeEntry *local_80;
  TVMRuntimeEntry *e;
  int *piStack_70;
  int local_68;
  undefined4 uStack_64;
  undefined1 local_50 [8];
  TVMRetValue rv;
  int *ret_type_code_local;
  TVMValue *ret_val_local;
  int num_args_local;
  int *arg_type_codes_local;
  TVMValue *args_local;
  TVMFunctionHandle func_local;
  
  rv.super_TVMPODValue_._8_8_ = ret_type_code;
  tvm::runtime::TVMRetValue::TVMRetValue((TVMRetValue *)local_50);
  tvm::runtime::TVMArgs::TVMArgs((TVMArgs *)&e,args,arg_type_codes,num_args);
  args_00.type_codes = piStack_70;
  args_00.values = (TVMValue *)e;
  args_00.num_args = local_68;
  args_00._20_4_ = uStack_64;
  tvm::runtime::PackedFunc::CallPacked((PackedFunc *)func,args_00,(TVMRetValue *)local_50);
  iVar1 = tvm::runtime::TVMPODValue_::type_code((TVMPODValue_ *)local_50);
  if (((iVar1 == 0xb) ||
      (iVar1 = tvm::runtime::TVMPODValue_::type_code((TVMPODValue_ *)local_50), iVar1 == 5)) ||
     (iVar1 = tvm::runtime::TVMPODValue_::type_code((TVMPODValue_ *)local_50), iVar1 == 0xc)) {
    local_80 = dmlc::ThreadLocalStore<TVMRuntimeEntry>::Get();
    iVar1 = tvm::runtime::TVMPODValue_::type_code((TVMPODValue_ *)local_50);
    if (iVar1 == 5) {
      tvm::runtime::TVMRetValue::operator_cast_to_string
                ((string *)&_except_,(TVMRetValue *)local_50);
      std::__cxx11::string::operator=((string *)local_80,(string *)&_except_);
      std::__cxx11::string::~string((string *)&_except_);
    }
    else {
      pbVar2 = tvm::runtime::TVMPODValue_::ptr<std::__cxx11::string>((TVMPODValue_ *)local_50);
      std::__cxx11::string::operator=((string *)local_80,(string *)pbVar2);
    }
    iVar1 = tvm::runtime::TVMPODValue_::type_code((TVMPODValue_ *)local_50);
    if (iVar1 == 0xc) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      (local_80->ret_bytes).data = pcVar3;
      sVar4 = std::__cxx11::string::length();
      (local_80->ret_bytes).size = sVar4;
      *(undefined4 *)rv.super_TVMPODValue_._8_8_ = 0xc;
      ret_val->v_handle = &local_80->ret_bytes;
    }
    else {
      *(undefined4 *)rv.super_TVMPODValue_._8_8_ = 0xb;
      iVar5 = std::__cxx11::string::c_str();
      ret_val->v_int64 = iVar5;
    }
  }
  else {
    tvm::runtime::TVMRetValue::MoveToCHost
              ((TVMRetValue *)local_50,ret_val,(int *)rv.super_TVMPODValue_._8_8_);
  }
  tvm::runtime::TVMRetValue::~TVMRetValue((TVMRetValue *)local_50);
  return 0;
}

Assistant:

int TVMFuncCall(TVMFunctionHandle func,
                TVMValue* args,
                int* arg_type_codes,
                int num_args,
                TVMValue* ret_val,
                int* ret_type_code) {
  API_BEGIN();
  TVMRetValue rv;
  (*static_cast<const PackedFunc*>(func)).CallPacked(
      TVMArgs(args, arg_type_codes, num_args), &rv);
  // handle return string.
  if (rv.type_code() == kTVMStr ||
      rv.type_code() == kTVMDataType ||
      rv.type_code() == kTVMBytes) {
    TVMRuntimeEntry* e = TVMAPIRuntimeStore::Get();
    if (rv.type_code() != kTVMDataType) {
      e->ret_str = *rv.ptr<std::string>();
    } else {
      e->ret_str = rv.operator std::string();
    }
    if (rv.type_code() == kTVMBytes) {
      e->ret_bytes.data = e->ret_str.c_str();
      e->ret_bytes.size = e->ret_str.length();
      *ret_type_code = kTVMBytes;
      ret_val->v_handle = &(e->ret_bytes);
    } else {
      *ret_type_code = kTVMStr;
      ret_val->v_str = e->ret_str.c_str();
    }
  } else {
    rv.MoveToCHost(ret_val, ret_type_code);
  }
  API_END();
}